

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::ParseProperties
          (SingleDocParser *this,string *tag,anchor_t *anchor,string *anchor_name)

{
  bool bVar1;
  Token *pTVar2;
  undefined8 *in_RDX;
  string *in_stack_00000098;
  SingleDocParser *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffd0;
  TYPE in_stack_ffffffffffffffd4;
  
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  *in_RDX = 0;
  while( true ) {
    while( true ) {
      bVar1 = Scanner::empty((Scanner *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (bVar1) {
        return;
      }
      pTVar2 = Scanner::peek((Scanner *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      in_stack_ffffffffffffffd4 = pTVar2->type;
      if (in_stack_ffffffffffffffd4 != ANCHOR) break;
      ParseAnchor(this,(anchor_t *)tag,(string *)anchor);
    }
    if (in_stack_ffffffffffffffd4 != TAG) break;
    ParseTag(in_stack_000000a0,in_stack_00000098);
  }
  return;
}

Assistant:

void SingleDocParser::ParseProperties(std::string& tag, anchor_t& anchor,
                                      std::string& anchor_name) {
  tag.clear();
  anchor_name.clear();
  anchor = NullAnchor;

  while (true) {
    if (m_scanner.empty())
      return;

    switch (m_scanner.peek().type) {
      case Token::TAG:
        ParseTag(tag);
        break;
      case Token::ANCHOR:
        ParseAnchor(anchor, anchor_name);
        break;
      default:
        return;
    }
  }
}